

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void __thiscall
duckdb::StandardColumnWriter<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>::Analyze
          (StandardColumnWriter<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *this,
          ColumnWriterState *state_p,ColumnWriterState *parent,Vector *vector,idx_t count)

{
  long lVar1;
  bool bVar2;
  size_type __n;
  idx_t iVar3;
  ulong uVar4;
  reference rVar5;
  
  if (parent == (ColumnWriterState *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = *(uint *)((long)&(parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) != 0
            || (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
               super__Bit_iterator_base._M_p !=
               (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base._M_p;
  }
  __n = (long)(state_p->definition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(state_p->definition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start >> 1;
  if (bVar2) {
    count = ((long)(parent->definition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(parent->definition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start >> 1) - __n;
  }
  lVar1 = *(long *)(vector + 0x20);
  FlatVector::VerifyFlatVector(vector);
  if (*(long *)(vector + 0x28) == 0 && !bVar2) {
    if (count != 0) {
      iVar3 = 0;
      do {
        PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>::Insert
                  (*(PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>
                     **)(lVar1 + iVar3 * 4),&state_p[2].definition_levels);
        state_p[1].parent_null_count = state_p[1].parent_null_count + 1;
        iVar3 = iVar3 + 1;
      } while (count != iVar3);
    }
  }
  else if (count != 0) {
    uVar4 = 0;
    do {
      if ((!bVar2) ||
         (rVar5 = vector<bool,_true>::get<true>(&parent->is_empty,__n),
         (*rVar5._M_p & rVar5._M_mask) == 0)) {
        if ((*(long *)(vector + 0x28) == 0) ||
           ((*(ulong *)(*(long *)(vector + 0x28) + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) != 0)) {
          PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>::Insert
                    (*(PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>
                       **)(lVar1 + uVar4 * 4),&state_p[2].definition_levels);
          state_p[1].parent_null_count = state_p[1].parent_null_count + 1;
        }
        uVar4 = uVar4 + 1;
      }
      __n = __n + 1;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

void Analyze(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector, idx_t count) override {
		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();

		auto data_ptr = FlatVector::GetData<SRC>(vector);
		idx_t vector_index = 0;

		const bool check_parent_empty = parent && !parent->is_empty.empty();
		const idx_t parent_index = state.definition_levels.size();

		const idx_t vcount =
		    check_parent_empty ? parent->definition_levels.size() - state.definition_levels.size() : count;

		const auto &validity = FlatVector::Validity(vector);

		if (!check_parent_empty && validity.AllValid()) {
			// Fast path
			for (; vector_index < vcount; vector_index++) {
				const auto &src_value = data_ptr[vector_index];
				state.dictionary.Insert(src_value);
				state.total_value_count++;
				state.total_string_size += DlbaEncoder::GetStringSize(src_value);
			}
		} else {
			for (idx_t i = 0; i < vcount; i++) {
				if (check_parent_empty && parent->is_empty[parent_index + i]) {
					continue;
				}
				if (validity.RowIsValid(vector_index)) {
					const auto &src_value = data_ptr[vector_index];
					state.dictionary.Insert(src_value);
					state.total_value_count++;
					state.total_string_size += DlbaEncoder::GetStringSize(src_value);
				}
				vector_index++;
			}
		}
	}